

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

string * getAutogenTargetName_abi_cxx11_(string *__return_storage_ptr__,cmTarget *target)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&target->Name);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static std::string getAutogenTargetName(cmTarget const* target)
{
  std::string autogenTargetName = target->GetName();
  autogenTargetName += "_automoc";
  return autogenTargetName;
}